

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseNumber
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  undefined1 local_68 [8];
  Status result;
  undefined1 local_30 [8];
  NumberResult number;
  
  ParseNumberHelper((Status *)local_68,this,(NumberResult *)local_30);
  if (local_68._0_4_ == OK) {
    if (local_30._0_4_ == DOUBLE) {
      (*this->ow_->_vptr_ObjectWriter[0xb])
                (number.type,this->ow_,(this->key_).ptr_,(this->key_).length_);
    }
    else if (local_30._0_4_ == INT) {
      (*this->ow_->_vptr_ObjectWriter[9])
                (this->ow_,(this->key_).ptr_,(this->key_).length_,number._0_8_);
    }
    else {
      if (local_30._0_4_ != UINT) {
        StringPiece::StringPiece
                  ((StringPiece *)((long)&result.error_message_.field_2 + 8),
                   "Unable to parse number.");
        ReportFailure(__return_storage_ptr__,this,stack0xffffffffffffffc0);
        goto LAB_0032e721;
      }
      (*this->ow_->_vptr_ObjectWriter[10])
                (this->ow_,(this->key_).ptr_,(this->key_).length_,number._0_8_);
    }
    (this->key_).ptr_ = (char *)0x0;
    (this->key_).length_ = 0;
  }
  Status::Status(__return_storage_ptr__,(Status *)local_68);
LAB_0032e721:
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseNumber() {
  NumberResult number;
  util::Status result = ParseNumberHelper(&number);
  if (result.ok()) {
    switch (number.type) {
      case NumberResult::DOUBLE:
        ow_->RenderDouble(key_, number.double_val);
        key_ = StringPiece();
        break;

      case NumberResult::INT:
        ow_->RenderInt64(key_, number.int_val);
        key_ = StringPiece();
        break;

      case NumberResult::UINT:
        ow_->RenderUint64(key_, number.uint_val);
        key_ = StringPiece();
        break;

      default:
        return ReportFailure("Unable to parse number.");
    }
  }
  return result;
}